

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O0

void __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>>::
_solve_impl<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>> *this,
          Matrix<double,_3,_1,_0,_3,_1> *rhs,Matrix<double,__1,_1,_0,__1,_1> *dst)

{
  double dVar1;
  HouseholderSequence<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>
  *this_00;
  PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *pPVar2;
  Scalar *pSVar3;
  Index IVar4;
  RowXpr local_1d8;
  double local_1a8;
  Index i_1;
  RowXpr local_170;
  Index local_140;
  Index i;
  Type local_100;
  Type local_c8;
  HouseholderSequenceType local_90;
  AdjointReturnType local_68;
  undefined1 local_40 [8];
  PlainObject c;
  Index nonzero_pivots;
  Matrix<double,__1,_1,_0,__1,_1> *dst_local;
  Matrix<double,_3,_1,_0,_3,_1> *rhs_local;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_local;
  
  c.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::nonzeroPivots
                         ((ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this);
  if (c.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] ==
      0.0) {
    DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dst);
  }
  else {
    Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_40,rhs);
    ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::householderQ
              (&local_90,(ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this);
    this_00 = HouseholderSequence<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>
              ::setLength(&local_90,
                          (Index)c.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2]);
    HouseholderSequence<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>
    ::adjoint(&local_68,this_00);
    MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
    applyOnTheLeft<Eigen::HouseholderSequence<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,1>>
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_40,
               (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>_>
                *)&local_68);
    DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::topLeftCorner<long,long>
              (&local_100,this,
               (long)c.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array[2],
               (long)c.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array[2]);
    MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,-1,-1,false>>::triangularView<2u>
              (&local_c8,&local_100);
    DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::topRows<long>
              ((Type *)&i,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_40,
               (long)c.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array[2]);
    TriangularViewImpl<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,-1,-1,false>const,2u,Eigen::Dense>
    ::solveInPlace<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>
              ((TriangularViewImpl<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,_1,_1,false>const,2u,Eigen::Dense>
                *)&local_c8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> *)&i);
    for (local_140 = 0;
        local_140 <
        (long)c.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [2]; local_140 = local_140 + 1) {
      DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::row
                (&local_170,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_40,local_140);
      pPVar2 = &PermutationMatrix<3,_3,_int>::indices((PermutationMatrix<3,_3,_int> *)(this + 0x60))
                ->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>;
      pSVar3 = PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::coeff(pPVar2,local_140);
      DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::row
                ((RowXpr *)&i_1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dst,
                 (long)*pSVar3);
      Block<Eigen::Matrix<double,-1,1,0,-1,1>,1,1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,1,1,false> *)&i_1,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1,_1,_false>_> *)
                 &local_170);
    }
    local_1a8 = c.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[2];
    while( true ) {
      dVar1 = local_1a8;
      IVar4 = ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols
                        ((ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this);
      if (IVar4 <= (long)dVar1) break;
      pPVar2 = &PermutationMatrix<3,_3,_int>::indices((PermutationMatrix<3,_3,_int> *)(this + 0x60))
                ->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>;
      pSVar3 = PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::coeff(pPVar2,(Index)local_1a8);
      DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::row
                (&local_1d8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dst,(long)*pSVar3)
      ;
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_1,_false>_>::setZero
                ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_1,_false>_> *)
                 &local_1d8);
      local_1a8 = (double)((long)local_1a8 + 1);
    }
  }
  return;
}

Assistant:

void ColPivHouseholderQR<_MatrixType>::_solve_impl(const RhsType &rhs, DstType &dst) const
{
  const Index nonzero_pivots = nonzeroPivots();

  if(nonzero_pivots == 0)
  {
    dst.setZero();
    return;
  }

  typename RhsType::PlainObject c(rhs);

  c.applyOnTheLeft(householderQ().setLength(nonzero_pivots).adjoint() );

  m_qr.topLeftCorner(nonzero_pivots, nonzero_pivots)
      .template triangularView<Upper>()
      .solveInPlace(c.topRows(nonzero_pivots));

  for(Index i = 0; i < nonzero_pivots; ++i) dst.row(m_colsPermutation.indices().coeff(i)) = c.row(i);
  for(Index i = nonzero_pivots; i < cols(); ++i) dst.row(m_colsPermutation.indices().coeff(i)).setZero();
}